

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::cpp::SafeFunctionName
                   (Descriptor *descriptor,FieldDescriptor *field,string *prefix)

{
  string *psVar1;
  FieldDescriptor *pFVar2;
  size_type sVar3;
  FieldDescriptor *in_RDX;
  string *in_RDI;
  string name;
  string *function_name;
  key_type *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  string *key;
  string *this;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string local_40 [64];
  
  key = in_RDI;
  psVar1 = FieldDescriptor::name_abi_cxx11_(in_RDX);
  this = local_40;
  std::__cxx11::string::string(this,(string *)psVar1);
  LowerString(in_stack_ffffffffffffff90);
  std::operator+(in_stack_ffffffffffffffb8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0) & 0xffffffff00ffffff
                 ));
  pFVar2 = Descriptor::FindFieldByName((Descriptor *)this,key);
  if (pFVar2 == (FieldDescriptor *)0x0) {
    sVar3 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x0,in_stack_ffffffffffffff88);
    if (sVar3 != 0) {
      std::__cxx11::string::append((char *)in_RDI);
    }
  }
  else {
    std::__cxx11::string::append((char *)in_RDI);
  }
  std::__cxx11::string::~string(local_40);
  return key;
}

Assistant:

std::string SafeFunctionName(const Descriptor* descriptor,
                             const FieldDescriptor* field,
                             const std::string& prefix) {
  // Do not use FieldName() since it will escape keywords.
  std::string name = field->name();
  LowerString(&name);
  std::string function_name = prefix + name;
  if (descriptor->FindFieldByName(function_name)) {
    // Single underscore will also make it conflicting with the private data
    // member. We use double underscore to escape function names.
    function_name.append("__");
  } else if (kKeywords.count(name) > 0) {
    // If the field name is a keyword, we append the underscore back to keep it
    // consistent with other function names.
    function_name.append("_");
  }
  return function_name;
}